

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

ostream * wasm::DataFlow::dump(Graph *graph,ostream *o)

{
  bool bVar1;
  reference this;
  ostream *poVar2;
  pointer pNVar3;
  LocalSet *pLVar4;
  LocalSet *set;
  unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_> *node;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
  *__range2;
  ostream *o_local;
  Graph *graph_local;
  
  __end2 = std::
           vector<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
           ::begin(&graph->nodes);
  node = (unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_> *)
         std::
         vector<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>
         ::end(&graph->nodes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_*,_std::vector<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>_>
                                *)&node);
    if (!bVar1) break;
    this = __gnu_cxx::
           __normal_iterator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_*,_std::vector<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>_>
           ::operator*(&__end2);
    poVar2 = std::operator<<(o,"NODE ");
    pNVar3 = std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>::get
                       (this);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pNVar3);
    std::operator<<(poVar2,": ");
    pNVar3 = std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>::get
                       (this);
    dump(pNVar3,o,0);
    pNVar3 = std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>::get
                       (this);
    pLVar4 = Graph::getSet(graph,pNVar3);
    if (pLVar4 != (LocalSet *)0x0) {
      poVar2 = std::operator<<(o,"  and that is set to local ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,pLVar4->index);
      std::operator<<(poVar2,'\n');
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_*,_std::vector<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>,_std::allocator<std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>_>
    ::operator++(&__end2);
  }
  return o;
}

Assistant:

inline std::ostream& dump(Graph& graph, std::ostream& o) {
  for (auto& node : graph.nodes) {
    o << "NODE " << node.get() << ": ";
    dump(node.get(), o);
    if (auto* set = graph.getSet(node.get())) {
      o << "  and that is set to local " << set->index << '\n';
    }
  }
  return o;
}